

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

ModelPtr __thiscall libcellml::Annotator::encapsulation(Annotator *this,string *id,size_t index)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ModelPtr MVar2;
  Annotator local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  item(&local_20,id,index);
  MVar2 = AnyCellmlElement::model((AnyCellmlElement *)this);
  _Var1 = MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_20.super_Logger.mPimpl != (LoggerImpl *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20.super_Logger.mPimpl);
    _Var1._M_pi = extraout_RDX;
  }
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Annotator::encapsulation(const std::string &id, size_t index)
{
    return item(id, index)->model();
}